

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules(cmMakefileLibraryTargetGenerator *this)

{
  cmMakefile *this_00;
  cmLocalUnixMakefileGenerator3 *this_01;
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  string local_f8;
  undefined1 local_d8 [8];
  string extraFlags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator local_89;
  string local_88;
  allocator local_51;
  undefined1 local_50 [8];
  string linkRuleVar;
  string linkLanguage;
  cmMakefileLibraryTargetGenerator *this_local;
  
  cmGeneratorTarget::GetLinkerLanguage
            ((string *)((long)&linkRuleVar.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,"CMAKE_",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::operator+=
            ((string *)local_50,(string *)(linkRuleVar.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_50,"_CREATE_STATIC_LIBRARY");
  std::allocator<char>::allocator();
  extraFlags.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)&local_88,"INTERPROCEDURAL_OPTIMIZATION",&local_89);
  bVar1 = cmCommonTargetGenerator::GetFeatureAsBool((cmCommonTargetGenerator *)this,&local_88);
  bVar3 = false;
  if (bVar1) {
    this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::operator+(&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_IPO");
    extraFlags.field_2._M_local_buf[0xf] = '\x01';
    pcVar2 = cmMakefile::GetDefinition(this_00,&local_b0);
    bVar3 = pcVar2 != (char *)0x0;
  }
  if ((extraFlags.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  if (bVar3) {
    std::__cxx11::string::operator+=((string *)local_50,"_IPO");
  }
  std::__cxx11::string::string((string *)local_d8);
  this_01 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmsys::SystemTools::UpperCase
            (&local_f8,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  cmLocalGenerator::GetStaticLibraryFlags
            ((cmLocalGenerator *)this_01,(string *)local_d8,&local_f8,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)&local_f8);
  WriteLibraryRules(this,(string *)local_50,(string *)local_d8,false);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(linkRuleVar.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules()
{
  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_STATIC_LIBRARY";

  if(this->GetFeatureAsBool("INTERPROCEDURAL_OPTIMIZATION") &&
     this->Makefile->GetDefinition(linkRuleVar+"_IPO"))
    {
    linkRuleVar += "_IPO";
    }

  std::string extraFlags;
  this->LocalGenerator->GetStaticLibraryFlags(extraFlags,
    cmSystemTools::UpperCase(this->ConfigName), this->GeneratorTarget);
  this->WriteLibraryRules(linkRuleVar, extraFlags, false);
}